

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkUniversal::Update(ChLinkUniversal *this,double time,bool update_assets)

{
  undefined8 uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ChMatrix33<double> Phi_pi2;
  ChMatrix33<double> Phi_pi1;
  ChFrame<double> frame2_abs;
  ChFrame<double> frame1_abs;
  ChMatrix33<double> local_278;
  ChMatrix33<double> *local_230;
  ChMatrix33<double> *local_228;
  double local_220;
  double local_218;
  undefined8 local_210;
  ulong local_208;
  ulong uStack_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  double local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  double local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  ChMatrix33<double> local_188;
  ChMatrix33<double> *local_138;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *local_130;
  undefined1 local_128 [24];
  double local_110;
  double local_e0;
  double local_c8;
  double local_b0;
  undefined1 local_a0 [24];
  double local_88;
  double local_60;
  double local_48;
  double local_30;
  
  ChLink::UpdateTime(&this->super_ChLink,time);
  ChFrame<double>::operator>>
            ((ChFrame<double> *)local_a0,&this->m_frame1,
             (ChFrame<double> *)(this->super_ChLink).Body1);
  ChFrame<double>::operator>>
            ((ChFrame<double> *)local_128,&this->m_frame2,
             (ChFrame<double> *)(this->super_ChLink).Body2);
  auVar5 = vsubpd_avx(local_128._8_16_,local_a0._8_16_);
  *(undefined1 (*) [16])
   (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array =
       auVar5;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
       = local_110 - local_88;
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ = 0;
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._4_4_ = 0;
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (this->m_frame1).coord.pos.m_data[2];
  local_230 = &(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
               Amatrix;
  auVar17._0_8_ =
       -local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar17._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar17);
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]._0_4_ =
       (undefined4)uVar1;
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]._4_4_ =
       (uint)((ulong)uVar1 >> 0x20);
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  auVar5 = *(undefined1 (*) [16])(this->m_frame1).coord.pos.m_data;
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (this->m_frame1).coord.pos.m_data[1];
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -auVar5._0_8_;
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]._4_4_ =
       auVar5._12_4_ ^ 0x80000000;
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]._0_4_ =
       auVar5._8_4_;
  uVar1 = vmovlpd_avx(auVar5);
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]._0_4_ =
       (undefined4)uVar1;
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]._4_4_ =
       (uint)((ulong)uVar1 >> 0x20);
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  local_228 = &local_278;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_188,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_230);
  local_230 = (ChMatrix33<double> *)0x0;
  local_218 = (this->m_frame2).coord.pos.m_data[2];
  local_138 = &(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
               Amatrix;
  auVar18._0_8_ = -local_218;
  auVar18._8_8_ = 0x8000000000000000;
  local_228 = (ChMatrix33<double> *)vmovlpd_avx(auVar18);
  local_210 = 0;
  auVar5 = *(undefined1 (*) [16])(this->m_frame2).coord.pos.m_data;
  local_220 = (this->m_frame2).coord.pos.m_data[1];
  local_208 = auVar5._0_8_ ^ 0x8000000000000000;
  uStack_200 = auVar5._8_8_ ^ 0x8000000000000000;
  local_1f8 = vmovlpd_avx(auVar5);
  local_1f0 = 0;
  local_130 = (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
               *)&local_230;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_278,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_138);
  auVar10 = ZEXT816(0) << 0x40;
  (this->m_cnstr_x).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = -1.0;
  (this->m_cnstr_x).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 1.0;
  *(undefined1 (*) [16])
   ((this->m_cnstr_x).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
    m_data.array + 1) = auVar10;
  *(undefined1 (*) [16])
   ((this->m_cnstr_x).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
    m_data.array + 1) = auVar10;
  (this->m_cnstr_x).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (this->m_cnstr_x).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  *(undefined4 *)
   ((this->m_cnstr_x).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
    m_data.array + 3) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_;
  *(uint *)((long)(this->m_cnstr_x).Cq_b.
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
                  array + 0x1c) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._4_4_
       ^ 0x80000000;
  *(undefined4 *)
   ((this->m_cnstr_x).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
    m_data.array + 4) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]._0_4_;
  *(uint *)((long)(this->m_cnstr_x).Cq_b.
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
                  array + 0x24) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]._4_4_
       ^ 0x80000000;
  (this->m_cnstr_x).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar19._0_8_ =
       -local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar19._8_4_ = 0;
  auVar19._12_4_ = 0x80000000;
  dVar2 = (double)vmovlps_avx(auVar19);
  (this->m_cnstr_x).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = dVar2;
  auVar5 = vmovhpd_avx(auVar10,0xbff0000000000000);
  *(undefined1 (*) [16])
   (this->m_cnstr_y).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
   m_data.array = auVar5;
  auVar5 = vmovhpd_avx(auVar10,0x3ff0000000000000);
  *(undefined1 (*) [16])
   (this->m_cnstr_y).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
   m_data.array = auVar5;
  (this->m_cnstr_y).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_y).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_y).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  (this->m_cnstr_y).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  *(undefined4 *)
   ((this->m_cnstr_y).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
    m_data.array + 3) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]._0_4_;
  *(uint *)((long)(this->m_cnstr_y).Cq_b.
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
                  array + 0x1c) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]._4_4_
       ^ 0x80000000;
  *(undefined4 *)
   ((this->m_cnstr_y).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
    m_data.array + 4) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]._0_4_;
  *(uint *)((long)(this->m_cnstr_y).Cq_b.
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
                  array + 0x24) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]._4_4_
       ^ 0x80000000;
  (this->m_cnstr_y).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar20._8_4_ = 0;
  auVar20._0_8_ =
       -local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar20._12_4_ = 0x80000000;
  dVar2 = (double)vmovlps_avx(auVar20);
  (this->m_cnstr_y).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = dVar2;
  *(undefined1 (*) [16])
   (this->m_cnstr_z).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
   m_data.array = auVar10;
  *(undefined1 (*) [16])
   (this->m_cnstr_z).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
   m_data.array = auVar10;
  (this->m_cnstr_z).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = -1.0;
  (this->m_cnstr_z).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 1.0;
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&this->m_u1_tilde;
  (this->m_cnstr_z).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  (this->m_cnstr_z).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  *(undefined4 *)
   ((this->m_cnstr_z).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
    m_data.array + 3) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]._0_4_;
  *(uint *)((long)(this->m_cnstr_z).Cq_b.
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
                  array + 0x1c) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]._4_4_
       ^ 0x80000000;
  *(undefined4 *)
   ((this->m_cnstr_z).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
    m_data.array + 4) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]._0_4_;
  *(uint *)((long)(this->m_cnstr_z).Cq_b.
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.
                  array + 0x24) =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]._4_4_
       ^ 0x80000000;
  (this->m_cnstr_z).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar11._8_4_ = 0;
  auVar11._0_8_ =
       -local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar11._12_4_ = 0x80000000;
  dVar2 = (double)vmovlps_avx(auVar11);
  (this->m_cnstr_z).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = dVar2;
  local_1a8._8_8_ = 0;
  local_1a8._0_8_ = local_60;
  local_1d8._8_8_ = 0;
  local_1d8._0_8_ = local_e0;
  local_198._8_8_ = 0;
  local_198._0_8_ = local_30;
  local_1c8._8_8_ = 0;
  local_1c8._0_8_ = local_b0;
  local_1b8 = local_48;
  uStack_1b0 = 0;
  local_1e8 = local_c8;
  uStack_1e0 = 0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_48 * local_c8;
  auVar5 = vfmadd231sd_fma(auVar12,local_1a8,local_1d8);
  auVar5 = vfmadd231sd_fma(auVar5,local_198,local_1c8);
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
       = auVar5._0_8_;
  local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_188,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_278);
  local_228 = &this->m_v2_tilde;
  local_230 = &(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
               Amatrix;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_278,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_230);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       local_1e8 *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar5 = vfmadd231sd_fma(auVar13,local_1d8,auVar5);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       local_1b8 *
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar10 = vfmadd231sd_fma(auVar21,local_1a8,auVar10);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar3 = vfmadd231sd_fma(auVar5,local_1c8,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar10 = vfmadd231sd_fma(auVar10,local_198,auVar4);
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  auVar26._0_8_ = local_1d8._0_8_;
  auVar26._8_8_ = auVar26._0_8_;
  auVar24._0_8_ =
       local_1e8 *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar24._8_8_ =
       local_1e8 *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar8._8_8_ = local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar8._0_8_ = local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar5 = vfmadd132pd_fma(auVar26,auVar24,auVar8);
  auVar25._8_8_ = local_1c8._0_8_;
  auVar25._0_8_ = local_1c8._0_8_;
  auVar9._8_8_ = local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar9._0_8_ = local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar5 = vfmadd132pd_fma(auVar25,auVar5,auVar9);
  auVar14._0_8_ = auVar3._0_8_ ^ 0x8000000000000000;
  auVar14._8_8_ = auVar3._8_8_ ^ 0x8000000000000000;
  auVar22._0_8_ = auVar10._0_8_ ^ 0x8000000000000000;
  auVar22._8_8_ = auVar10._8_8_ ^ 0x8000000000000000;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = -auVar5._0_8_;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = -auVar5._8_8_;
  dVar2 = (double)vmovlpd_avx(auVar14);
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = dVar2;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  auVar23._8_8_ = local_1a8._0_8_;
  auVar23._0_8_ = local_1a8._0_8_;
  auVar15._0_8_ =
       local_1b8 *
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar15._8_8_ =
       local_1b8 *
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar6._8_4_ = local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1]._0_4_;
  auVar6._0_8_ = local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar6._12_4_ =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]._4_4_;
  auVar5 = vfmadd132pd_fma(auVar23,auVar15,auVar6);
  auVar16._8_8_ = local_198._0_8_;
  auVar16._0_8_ = local_198._0_8_;
  auVar7._4_4_ = local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6]._4_4_;
  auVar7._0_4_ = local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6]._0_4_;
  auVar7._8_4_ = local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7]._0_4_;
  auVar7._12_4_ =
       local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]._4_4_;
  auVar5 = vfmadd132pd_fma(auVar16,auVar5,auVar7);
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = -auVar5._0_8_;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = -auVar5._8_8_;
  dVar2 = (double)vmovlpd_avx(auVar22);
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = dVar2;
  return;
}

Assistant:

void ChLinkUniversal::Update(double time, bool update_assets) {
    // Inherit time changes of parent class
    ChLink::UpdateTime(time);

    // Express the joint frames in absolute frame
    ChFrame<> frame1_abs = m_frame1 >> *Body1;
    ChFrame<> frame2_abs = m_frame2 >> *Body2;

    // Calculate violations of the spherical constraints
    m_C(0) = frame2_abs.coord.pos.x() - frame1_abs.coord.pos.x();
    m_C(1) = frame2_abs.coord.pos.y() - frame1_abs.coord.pos.y();
    m_C(2) = frame2_abs.coord.pos.z() - frame1_abs.coord.pos.z();

    // Compute Jacobian of the spherical constraints
    //    pos2_abs - pos1_abs = 0
    {
        ChMatrix33<> Phi_pi1 = Body1->GetA() * ChStarMatrix33<>(m_frame1.coord.pos);
        ChMatrix33<> Phi_pi2 = Body2->GetA() * ChStarMatrix33<>(m_frame2.coord.pos);

        m_cnstr_x.Get_Cq_a()(0) = -1;
        m_cnstr_x.Get_Cq_b()(0) = +1;
        m_cnstr_x.Get_Cq_a()(1) = 0;
        m_cnstr_x.Get_Cq_b()(1) = 0;
        m_cnstr_x.Get_Cq_a()(2) = 0;
        m_cnstr_x.Get_Cq_b()(2) = 0;
        m_cnstr_x.Get_Cq_a()(3) = Phi_pi1(0, 0);
        m_cnstr_x.Get_Cq_b()(3) = -Phi_pi2(0, 0);
        m_cnstr_x.Get_Cq_a()(4) = Phi_pi1(0, 1);
        m_cnstr_x.Get_Cq_b()(4) = -Phi_pi2(0, 1);
        m_cnstr_x.Get_Cq_a()(5) = Phi_pi1(0, 2);
        m_cnstr_x.Get_Cq_b()(5) = -Phi_pi2(0, 2);

        m_cnstr_y.Get_Cq_a()(0) = 0;
        m_cnstr_y.Get_Cq_b()(0) = 0;
        m_cnstr_y.Get_Cq_a()(1) = -1;
        m_cnstr_y.Get_Cq_b()(1) = +1;
        m_cnstr_y.Get_Cq_a()(2) = 0;
        m_cnstr_y.Get_Cq_b()(2) = 0;
        m_cnstr_y.Get_Cq_a()(3) = Phi_pi1(1, 0);
        m_cnstr_y.Get_Cq_b()(3) = -Phi_pi2(1, 0);
        m_cnstr_y.Get_Cq_a()(4) = Phi_pi1(1, 1);
        m_cnstr_y.Get_Cq_b()(4) = -Phi_pi2(1, 1);
        m_cnstr_y.Get_Cq_a()(5) = Phi_pi1(1, 2);
        m_cnstr_y.Get_Cq_b()(5) = -Phi_pi2(1, 2);

        m_cnstr_z.Get_Cq_a()(0) = 0;
        m_cnstr_z.Get_Cq_b()(0) = 0;
        m_cnstr_z.Get_Cq_a()(1) = 0;
        m_cnstr_z.Get_Cq_b()(1) = 0;
        m_cnstr_z.Get_Cq_a()(2) = -1;
        m_cnstr_z.Get_Cq_b()(2) = +1;
        m_cnstr_z.Get_Cq_a()(3) = Phi_pi1(2, 0);
        m_cnstr_z.Get_Cq_b()(3) = -Phi_pi2(2, 0);
        m_cnstr_z.Get_Cq_a()(4) = Phi_pi1(2, 1);
        m_cnstr_z.Get_Cq_b()(4) = -Phi_pi2(2, 1);
        m_cnstr_z.Get_Cq_a()(5) = Phi_pi1(2, 2);
        m_cnstr_z.Get_Cq_b()(5) = -Phi_pi2(2, 2);
    }

    // Calculate violation of the dot constraint
    ChVector<> u1 = frame1_abs.GetA().Get_A_Xaxis();
    ChVector<> v2 = frame2_abs.GetA().Get_A_Yaxis();

    m_C(3) = Vdot(u1, v2);

    // Compute Jacobian of the dot constraint
    //    dot(u1_abs, v2_abs) = 0
    {
        ChMatrix33<> mat1 = Body1->GetA() * m_u1_tilde;
        ChMatrix33<> mat2 = Body2->GetA() * m_v2_tilde;
        ChVector<> Phi_pi1 = mat1.transpose() * v2;
        ChVector<> Phi_pi2 = mat2.transpose() * u1;

        m_cnstr_dot.Get_Cq_a()(0) = 0;
        m_cnstr_dot.Get_Cq_a()(1) = 0;
        m_cnstr_dot.Get_Cq_a()(2) = 0;
        m_cnstr_dot.Get_Cq_a()(3) = -Phi_pi1.x();
        m_cnstr_dot.Get_Cq_a()(4) = -Phi_pi1.y();
        m_cnstr_dot.Get_Cq_a()(5) = -Phi_pi1.z();

        m_cnstr_dot.Get_Cq_b()(0) = 0;
        m_cnstr_dot.Get_Cq_b()(1) = 0;
        m_cnstr_dot.Get_Cq_b()(2) = 0;
        m_cnstr_dot.Get_Cq_b()(3) = -Phi_pi2.x();
        m_cnstr_dot.Get_Cq_b()(4) = -Phi_pi2.y();
        m_cnstr_dot.Get_Cq_b()(5) = -Phi_pi2.z();
    }
}